

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManTransformMiter2(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  uVar17 = p->vCos->nSize - p->nRegs;
  if ((uVar17 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xb96,"Gia_Man_t *Gia_ManTransformMiter2(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar19 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar19];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ead9c;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_001eadbb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_001eadbb;
      pGVar5[iVar7].Value = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
      pVVar11 = p->vCis;
    } while (lVar19 < pVVar11->nSize);
  }
  if (0 < p->nObjs) {
    lVar21 = 8;
    lVar19 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar5 + lVar21 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar1 = *(uint *)((long)pGVar5 +
                         lVar21 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar8 = *(uint *)((long)pGVar5 +
                             lVar21 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar8 < 0)) goto LAB_001eadda;
        iVar7 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar8 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar5->field_0x0 + lVar21) = iVar7;
      }
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0xc;
    } while (lVar19 < p->nObjs);
  }
  pVVar11 = p->vCos;
  uVar1 = pVVar11->nSize;
  uVar16 = (ulong)uVar1;
  uVar8 = uVar1 - p->nRegs;
  uVar13 = (ulong)uVar8;
  if (uVar8 != 0 && p->nRegs <= (int)uVar1) {
    lVar19 = (long)((int)uVar17 / 2);
    uVar20 = 0;
    do {
      if ((long)(int)uVar16 <= (long)uVar20) goto LAB_001eadf9;
      iVar7 = pVVar11->pArray[uVar20];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ead9c;
      if (((uint)((int)uVar17 / 2) == uVar20) || (pGVar5 = p->pObjs, pGVar5 == (Gia_Obj_t *)0x0))
      break;
      if ((int)uVar13 <= lVar19) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar17 < -1) || ((int)uVar16 <= lVar19)) goto LAB_001eadf9;
      iVar18 = pVVar11->pArray[lVar19];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_001ead9c;
      uVar8 = (uint)*(undefined8 *)(pGVar5 + iVar7);
      uVar1 = (pGVar5 + iVar7)[-(ulong)(uVar8 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001eadda;
      uVar15 = (uint)*(undefined8 *)(pGVar5 + iVar18);
      uVar2 = (pGVar5 + iVar18)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) goto LAB_001eadda;
      iVar7 = Gia_ManHashXor(p_00,uVar8 >> 0x1d & 1 ^ uVar1,uVar15 >> 0x1d & 1 ^ uVar2);
      Gia_ManAppendCo(p_00,iVar7);
      uVar20 = uVar20 + 1;
      pVVar11 = p->vCos;
      uVar16 = (ulong)pVVar11->nSize;
      uVar13 = uVar16 - (long)p->nRegs;
      lVar19 = lVar19 + 1;
    } while ((long)uVar20 < (long)uVar13);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar18 = 0;
    do {
      iVar3 = p->vCos->nSize;
      uVar17 = (iVar3 - iVar7) + iVar18;
      if (((int)uVar17 < 0) || (iVar3 <= (int)uVar17)) {
LAB_001eadf9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCos->pArray[uVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001ead9c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar7;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0) {
LAB_001eadda:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar17 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                    pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value
                              );
      pGVar5->Value = uVar17;
      iVar18 = iVar18 + 1;
      iVar7 = p->nRegs;
    } while (iVar18 < iVar7);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManTransformMiter2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, iLit, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(pObj2) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}